

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::compareEqual<char[28],std::basic_string_view<char,std::char_traits<char>>>
               (char (*lhs) [28],basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  
  __n = strlen(*lhs);
  if (__n == rhs->_M_len) {
    if (__n != 0) {
      iVar2 = bcmp(lhs,rhs->_M_str,__n);
      if (iVar2 != 0) goto LAB_0057ab85;
    }
    bVar1 = true;
  }
  else {
LAB_0057ab85:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }